

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::anon_unknown_0::ProgramUniformCase::test(ProgramUniformCase *this)

{
  CallLogWrapper *pCVar1;
  TestLog *log;
  char *pcVar2;
  char *__s;
  char *pcVar3;
  bool bVar4;
  GLuint GVar5;
  GLuint shader;
  GLuint program;
  long *plVar6;
  size_t sVar7;
  long *plVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  size_type *psVar10;
  long lVar11;
  string fragmentSource;
  char *fragmentSourceCStr;
  ostringstream frag;
  undefined1 auStack_258 [12];
  GLuint local_24c;
  GLuint local_248;
  allocator<char> local_241;
  CallLogWrapper *local_240;
  string local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_218;
  long local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  GLuint local_1f4;
  long *local_1f0;
  long local_1e8;
  long local_1e0;
  long lStack_1d8;
  long *local_1d0 [2];
  long local_1c0 [2];
  ScopedLogSection local_1b0;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  pCVar1 = &(this->super_ApiCase).super_CallLogWrapper;
  GVar5 = glu::CallLogWrapper::glCreateShader(pCVar1,0x8b31);
  shader = glu::CallLogWrapper::glCreateShader(pCVar1,0x8b30);
  program = glu::CallLogWrapper::glCreateProgram(pCVar1);
  glu::CallLogWrapper::glAttachShader(pCVar1,program,GVar5);
  local_24c = program;
  local_248 = shader;
  glu::CallLogWrapper::glAttachShader(pCVar1,program,shader);
  glu::CallLogWrapper::glShaderSource(pCVar1,GVar5,1,&test::vertSource,(GLint *)0x0);
  local_240 = pCVar1;
  local_1f4 = GVar5;
  glu::CallLogWrapper::glCompileShader(pCVar1,GVar5);
  ApiCase::expectError(&this->super_ApiCase,0);
  lVar11 = 0x30;
  do {
    log = (this->super_ApiCase).m_log;
    pcVar2 = *(char **)((long)&PTR_deinit_0214f210 + lVar11);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_1a8,pcVar2,&local_241);
    local_1d0[0] = local_1c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"Verify type of ","");
    plVar6 = (long *)std::__cxx11::string::append((char *)local_1d0);
    local_1f0 = &local_1e0;
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_1e0 = *plVar8;
      lStack_1d8 = plVar6[3];
    }
    else {
      local_1e0 = *plVar8;
      local_1f0 = (long *)*plVar6;
    }
    local_1e8 = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1f0);
    local_218 = &local_208;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 == paVar9) {
      local_208._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_208._8_8_ = plVar6[3];
    }
    else {
      local_208._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_218 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar6;
    }
    local_210 = plVar6[1];
    *plVar6 = (long)paVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    __s = *(char **)((long)&PTR_iterate_0214f218 + lVar11);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_218);
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    psVar10 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_238.field_2._M_allocated_capacity = *psVar10;
      local_238.field_2._8_8_ = plVar6[3];
    }
    else {
      local_238.field_2._M_allocated_capacity = *psVar10;
      local_238._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_238._M_string_length = plVar6[1];
    *plVar6 = (long)psVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    tcu::ScopedLogSection::ScopedLogSection(&local_1b0,log,local_1a8,&local_238);
    tcu::TestLog::endSection(local_1b0.m_log);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    if (local_218 != &local_208) {
      operator_delete(local_218,local_208._M_allocated_capacity + 1);
    }
    if (local_1f0 != &local_1e0) {
      operator_delete(local_1f0,local_1e0 + 1);
    }
    if (local_1d0[0] != local_1c0) {
      operator_delete(local_1d0[0],local_1c0[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"#version 300 es\n",0x10);
    pcVar3 = *(char **)((long)&Functional::(anonymous_namespace)::ProgramUniformCase::typeinfo +
                       lVar11);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)auStack_258 + (int)*(undefined8 *)(local_1a8[0]._M_dataplus._M_p + -0x18)
                      + 0xb0);
    }
    else {
      sVar7 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"uniform ",8);
    pcVar3 = *(char **)((long)&PTR_test_0214f220 + lVar11);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)auStack_258 + (int)*(undefined8 *)(local_1a8[0]._M_dataplus._M_p + -0x18)
                      + 0xb0);
    }
    else {
      sVar7 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)auStack_258 + (int)*(undefined8 *)(local_1a8[0]._M_dataplus._M_p + -0x18)
                      + 0xb0);
    }
    else {
      sVar7 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar2,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," uniformValue",0xd);
    if (__s == (char *)0x0) {
      std::ios::clear((int)auStack_258 + (int)*(undefined8 *)(local_1a8[0]._M_dataplus._M_p + -0x18)
                      + 0xb0);
    }
    else {
      sVar7 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(location = 0) out mediump vec4 fragColor;\n",0x31);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tfragColor = vec4(",0x12);
    pcVar2 = *(char **)((long)&PTR_typeinfo_name_0214f230 + lVar11);
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)auStack_258 + (int)*(undefined8 *)(local_1a8[0]._M_dataplus._M_p + -0x18)
                      + 0xb0);
    }
    else {
      sVar7 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar2,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,");\n",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
    std::__cxx11::stringbuf::str();
    local_218 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238._M_dataplus._M_p;
    glu::CallLogWrapper::glShaderSource(local_240,local_248,1,(GLchar **)&local_218,(GLint *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    glu::CallLogWrapper::glCompileShader(local_240,local_248);
    glu::CallLogWrapper::glLinkProgram(local_240,local_24c);
    bVar4 = verifyProgramParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                               m_testCtx,local_240,local_24c,0x8b82,1);
    pCVar1 = local_240;
    GVar5 = local_24c;
    if (bVar4) {
      local_218 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x1bd666c;
      local_238._M_dataplus._M_p = (pointer)0xdededededededede;
      local_238._M_string_length = CONCAT44(local_238._M_string_length._4_4_,0xdededede);
      glu::CallLogWrapper::glGetUniformIndices
                (local_240,local_24c,1,(GLchar **)&local_218,
                 (GLuint *)((long)&local_238._M_dataplus._M_p + 4));
      deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_int>::verifyValidity
                ((StateQueryMemoryWriteGuard<unsigned_int> *)&local_238,
                 (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
      verifyActiveUniformParam
                ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,pCVar1
                 ,GVar5,local_238._M_dataplus._M_p._4_4_,0x8a37,
                 *(GLenum *)((long)&PTR_typeinfo_0214f238 + lVar11));
      verifyActiveUniformParam
                ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,pCVar1
                 ,GVar5,local_238._M_dataplus._M_p._4_4_,0x8a38,
                 *(GLenum *)((long)&PTR_typeinfo_0214f238 + lVar11 + 4));
      verifyActiveUniformParam
                ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,pCVar1
                 ,GVar5,local_238._M_dataplus._M_p._4_4_,0x8a3e,
                 *(GLenum *)((long)&DAT_0214f240 + lVar11));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    pCVar1 = local_240;
    lVar11 = lVar11 + 0x38;
  } while (lVar11 != 0x928);
  glu::CallLogWrapper::glDeleteShader(local_240,local_1f4);
  glu::CallLogWrapper::glDeleteShader(pCVar1,local_248);
  glu::CallLogWrapper::glDeleteProgram(pCVar1,local_24c);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		const struct UniformType
		{
			const char* declaration;
			const char* postDeclaration;
			const char* precision;
			const char* layout;
			const char* getter;
			GLenum		type;
			GLint		size;
			GLint		isRowMajor;
		} uniformTypes[] =
		{
			{ "float",					"",			"highp",	"",						"uniformValue",							GL_FLOAT,							1, GL_FALSE },
			{ "float[2]",				"",			"highp",	"",						"uniformValue[1]",						GL_FLOAT,							2, GL_FALSE },
			{ "vec2",					"",			"highp",	"",						"uniformValue.x",						GL_FLOAT_VEC2,						1, GL_FALSE },
			{ "vec3",					"",			"highp",	"",						"uniformValue.x",						GL_FLOAT_VEC3,						1, GL_FALSE },
			{ "vec4",					"",			"highp",	"",						"uniformValue.x",						GL_FLOAT_VEC4,						1, GL_FALSE },
			{ "int",					"",			"highp",	"",						"float(uniformValue)",					GL_INT,								1, GL_FALSE },
			{ "ivec2",					"",			"highp",	"",						"float(uniformValue.x)",				GL_INT_VEC2,						1, GL_FALSE },
			{ "ivec3",					"",			"highp",	"",						"float(uniformValue.x)",				GL_INT_VEC3,						1, GL_FALSE },
			{ "ivec4",					"",			"highp",	"",						"float(uniformValue.x)",				GL_INT_VEC4,						1, GL_FALSE },
			{ "uint",					"",			"highp",	"",						"float(uniformValue)",					GL_UNSIGNED_INT,					1, GL_FALSE },
			{ "uvec2",					"",			"highp",	"",						"float(uniformValue.x)",				GL_UNSIGNED_INT_VEC2,				1, GL_FALSE },
			{ "uvec3",					"",			"highp",	"",						"float(uniformValue.x)",				GL_UNSIGNED_INT_VEC3,				1, GL_FALSE },
			{ "uvec4",					"",			"highp",	"",						"float(uniformValue.x)",				GL_UNSIGNED_INT_VEC4,				1, GL_FALSE },
			{ "bool",					"",			"",			"",						"float(uniformValue)",					GL_BOOL,							1, GL_FALSE },
			{ "bvec2",					"",			"",			"",						"float(uniformValue.x)",				GL_BOOL_VEC2,						1, GL_FALSE },
			{ "bvec3",					"",			"",			"",						"float(uniformValue.x)",				GL_BOOL_VEC3,						1, GL_FALSE },
			{ "bvec4",					"",			"",			"",						"float(uniformValue.x)",				GL_BOOL_VEC4,						1, GL_FALSE },
			{ "mat2",					"",			"highp",	"",						"float(uniformValue[0][0])",			GL_FLOAT_MAT2,						1, GL_FALSE },
			{ "mat3",					"",			"highp",	"",						"float(uniformValue[0][0])",			GL_FLOAT_MAT3,						1, GL_FALSE },
			{ "mat4",					"",			"highp",	"",						"float(uniformValue[0][0])",			GL_FLOAT_MAT4,						1, GL_FALSE },
			{ "mat2x3",					"",			"highp",	"",						"float(uniformValue[0][0])",			GL_FLOAT_MAT2x3,					1, GL_FALSE },
			{ "mat2x4",					"",			"highp",	"",						"float(uniformValue[0][0])",			GL_FLOAT_MAT2x4,					1, GL_FALSE },
			{ "mat3x2",					"",			"highp",	"",						"float(uniformValue[0][0])",			GL_FLOAT_MAT3x2,					1, GL_FALSE },
			{ "mat3x4",					"",			"highp",	"",						"float(uniformValue[0][0])",			GL_FLOAT_MAT3x4,					1, GL_FALSE },
			{ "mat4x2",					"",			"highp",	"",						"float(uniformValue[0][0])",			GL_FLOAT_MAT4x2,					1, GL_FALSE },
			{ "mat4x3",					"",			"highp",	"",						"float(uniformValue[0][0])",			GL_FLOAT_MAT4x3,					1, GL_FALSE },
			{ "sampler2D",				"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_SAMPLER_2D,						1, GL_FALSE },
			{ "sampler3D",				"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_SAMPLER_3D,						1, GL_FALSE },
			{ "samplerCube",			"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_SAMPLER_CUBE,					1, GL_FALSE },
			{ "sampler2DShadow",		"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_SAMPLER_2D_SHADOW,				1, GL_FALSE },
			{ "sampler2DArray",			"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_SAMPLER_2D_ARRAY,				1, GL_FALSE },
			{ "sampler2DArrayShadow",	"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_SAMPLER_2D_ARRAY_SHADOW,			1, GL_FALSE },
			{ "samplerCubeShadow",		"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_SAMPLER_CUBE_SHADOW,				1, GL_FALSE },
			{ "isampler2D",				"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_INT_SAMPLER_2D,					1, GL_FALSE },
			{ "isampler3D",				"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_INT_SAMPLER_3D,					1, GL_FALSE },
			{ "isamplerCube",			"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_INT_SAMPLER_CUBE,				1, GL_FALSE },
			{ "isampler2DArray",		"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_INT_SAMPLER_2D_ARRAY,			1, GL_FALSE },
			{ "usampler2D",				"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_UNSIGNED_INT_SAMPLER_2D,			1, GL_FALSE },
			{ "usampler3D",				"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_UNSIGNED_INT_SAMPLER_3D,			1, GL_FALSE },
			{ "usamplerCube",			"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_UNSIGNED_INT_SAMPLER_CUBE,		1, GL_FALSE },
			{ "usampler2DArray",		"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_UNSIGNED_INT_SAMPLER_2D_ARRAY,	1, GL_FALSE },
		};

		static const char* vertSource =
			"#version 300 es\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = vec4(0.0);\n"
			"}\n\0";

		GLuint shaderVert	= glCreateShader(GL_VERTEX_SHADER);
		GLuint shaderFrag	= glCreateShader(GL_FRAGMENT_SHADER);
		GLuint program		= glCreateProgram();

		glAttachShader(program, shaderVert);
		glAttachShader(program, shaderFrag);

		glShaderSource(shaderVert, 1, &vertSource, DE_NULL);
		glCompileShader(shaderVert);
		expectError(GL_NO_ERROR);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(uniformTypes); ++ndx)
		{
			tcu::ScopedLogSection(m_log, uniformTypes[ndx].declaration, std::string("Verify type of ") + uniformTypes[ndx].declaration + " variable" + uniformTypes[ndx].postDeclaration );

			// gen fragment shader

			std::ostringstream frag;
			frag << "#version 300 es\n";
			frag << uniformTypes[ndx].layout << "uniform " << uniformTypes[ndx].precision << " " << uniformTypes[ndx].declaration << " uniformValue" << uniformTypes[ndx].postDeclaration << ";\n";
			frag << "layout(location = 0) out mediump vec4 fragColor;\n";
			frag << "void main (void)\n";
			frag << "{\n";
			frag << "	fragColor = vec4(" << uniformTypes[ndx].getter << ");\n";
			frag << "}\n";

			{
				std::string fragmentSource = frag.str();
				const char* fragmentSourceCStr = fragmentSource.c_str();
				glShaderSource(shaderFrag, 1, &fragmentSourceCStr, DE_NULL);
			}

			// compile & link

			glCompileShader(shaderFrag);
			glLinkProgram(program);

			// test
			if (verifyProgramParam(m_testCtx, *this, program, GL_LINK_STATUS, GL_TRUE))
			{
				const char* uniformNames[] = {"uniformValue"};
				StateQueryMemoryWriteGuard<GLuint> uniformIndex;
				glGetUniformIndices(program, 1, uniformNames, &uniformIndex);
				uniformIndex.verifyValidity(m_testCtx);

				verifyActiveUniformParam(m_testCtx, *this, program, uniformIndex, GL_UNIFORM_TYPE,			uniformTypes[ndx].type);
				verifyActiveUniformParam(m_testCtx, *this, program, uniformIndex, GL_UNIFORM_SIZE,			uniformTypes[ndx].size);
				verifyActiveUniformParam(m_testCtx, *this, program, uniformIndex, GL_UNIFORM_IS_ROW_MAJOR,	uniformTypes[ndx].isRowMajor);
			}
		}

		glDeleteShader(shaderVert);
		glDeleteShader(shaderFrag);
		glDeleteProgram(program);
		expectError(GL_NO_ERROR);
	}